

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_DecStop(Sfm_Dec_t *p)

{
  uint uVar1;
  Abc_Ntk_t *pNtk_00;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pObj_00;
  uint local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  Sfm_Dec_t *p_local;
  
  pNtk_00 = p->pNtk;
  for (local_24 = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), (int)local_24 < iVar2;
      local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkObj(pNtk_00,local_24);
    if (((pObj_00 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj_00), iVar2 != 0)) &&
       (uVar1 = *(uint *)&pObj_00->field_0x14, uVar3 = Abc_ObjLevelNew(pObj_00),
       uVar1 >> 0xc != uVar3)) {
      printf("Level count mismatch at node %d.\n",(ulong)local_24);
    }
  }
  Sfm_LibStop(p->pLib);
  if (p->pTim != (Sfm_Tim_t *)0x0) {
    Sfm_TimStop(p->pTim);
  }
  if (p->pMit != (Sfm_Mit_t *)0x0) {
    Sfm_MitStop(p->pMit);
  }
  for (local_24 = 0; (int)local_24 < 8; local_24 = local_24 + 1) {
    if (p->pDivWords[(int)local_24] != (word *)0x0) {
      free(p->pDivWords[(int)local_24]);
      p->pDivWords[(int)local_24] = (word *)0x0;
    }
  }
  Vec_IntErase(&p->vGateSizes);
  Vec_WrdErase(&p->vGateFuncs);
  Vec_WecErase(&p->vGateCnfs);
  Vec_PtrErase(&p->vGateHands);
  Vec_IntErase(&p->vObjRoots);
  Vec_IntErase(&p->vObjGates);
  Vec_WecErase(&p->vObjFanins);
  Vec_IntErase(&p->vObjMap);
  Vec_IntErase(&p->vObjDec);
  Vec_IntErase(&p->vObjMffc);
  Vec_IntErase(&p->vObjInMffc);
  Vec_WrdErase(&p->vObjSims);
  Vec_WrdErase(&p->vObjSims2);
  Vec_PtrErase(&p->vMatchGates);
  Vec_PtrErase(&p->vMatchFans);
  sat_solver_delete(p->pSat);
  Vec_WecErase(&p->vClauses);
  Vec_IntErase(p->vImpls);
  Vec_IntErase(p->vImpls + 1);
  Vec_WrdErase(p->vSets);
  Vec_WrdErase(p->vSets + 1);
  Vec_IntErase(&p->vNewNodes);
  Vec_IntErase(&p->vGateTfi);
  Vec_IntErase(&p->vGateTfo);
  Vec_IntErase(&p->vGateCut);
  Vec_IntErase(&p->vGateTemp);
  Vec_IntErase(&p->vGateMffc);
  Vec_IntErase(&p->vCands);
  if (p != (Sfm_Dec_t *)0x0) {
    free(p);
  }
  pNtk_00->pData = (void *)0x0;
  return;
}

Assistant:

void Sfm_DecStop( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( (int)pObj->Level != Abc_ObjLevelNew(pObj) )
            printf( "Level count mismatch at node %d.\n", i );
    Sfm_LibStop( p->pLib );
    if ( p->pTim ) Sfm_TimStop( p->pTim );
    if ( p->pMit ) Sfm_MitStop( p->pMit );
    // divisors
    for ( i = 0; i < SFM_SUPP_MAX; i++ )
        ABC_FREE( p->pDivWords[i] );
    // library
    Vec_IntErase( &p->vGateSizes );
    Vec_WrdErase( &p->vGateFuncs );
    Vec_WecErase( &p->vGateCnfs );
    Vec_PtrErase( &p->vGateHands );
    // objects
    Vec_IntErase( &p->vObjRoots );
    Vec_IntErase( &p->vObjGates );
    Vec_WecErase( &p->vObjFanins );
    Vec_IntErase( &p->vObjMap );
    Vec_IntErase( &p->vObjDec );
    Vec_IntErase( &p->vObjMffc );
    Vec_IntErase( &p->vObjInMffc );
    Vec_WrdErase( &p->vObjSims );
    Vec_WrdErase( &p->vObjSims2 );
    Vec_PtrErase( &p->vMatchGates );
    Vec_PtrErase( &p->vMatchFans );
    // solver
    sat_solver_delete( p->pSat );
    Vec_WecErase( &p->vClauses );
    Vec_IntErase( &p->vImpls[0] );
    Vec_IntErase( &p->vImpls[1] );
    Vec_WrdErase( &p->vSets[0] );
    Vec_WrdErase( &p->vSets[1] );
    // temporary
    Vec_IntErase( &p->vNewNodes );
    Vec_IntErase( &p->vGateTfi );
    Vec_IntErase( &p->vGateTfo );
    Vec_IntErase( &p->vGateCut );
    Vec_IntErase( &p->vGateTemp );
    Vec_IntErase( &p->vGateMffc );
    Vec_IntErase( &p->vCands );
    ABC_FREE( p );
    pNtk->pData = NULL;
}